

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O0

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::update_cohomology_groups
          (Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Simplex_handle *sigma,int dim_sigma)

{
  Arith_element AVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Element EVar5;
  reference ppVar6;
  pointer ppVar7;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_f8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_f0;
  tuple<int&,int&> local_e8 [16];
  pair<int,_int> local_d8;
  undefined1 local_d0 [16];
  reverse_iterator a_ds_rit;
  int local_b8;
  Arith_element prod;
  Arith_element charac;
  Arith_element inv_x;
  pair<const_unsigned_int,_int> local_a8;
  pair<const_unsigned_int,_int> map_a_ds_ref;
  iterator __end0;
  iterator __begin0;
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  *__range4;
  A_ds_type a_ds;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_58;
  undefined1 local_50 [8];
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  map_a_ds;
  int dim_sigma_local;
  Simplex_handle *sigma_local;
  Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
  *this_local;
  
  map_a_ds._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = dim_sigma;
  std::
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::map((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
         *)local_50);
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  ::vec_iterator(&local_58,sigma);
  annotation_of_the_boundary
            (this,(map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   *)local_50,&local_58,
             map_a_ds._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  bVar2 = std::
          map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          ::empty((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   *)local_50);
  if (bVar2) {
    if (map_a_ds._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < this->dim_max_) {
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
      ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                      *)&a_ds.
                         super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,sigma);
      EVar5 = Field_Zp::multiplicative_identity(&this->coeff_field_,0);
      iVar4 = Field_Zp::characteristic(&this->coeff_field_);
      create_cocycle(this,(Simplex_handle *)
                          &a_ds.
                           super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,EVar5,iVar4);
    }
  }
  else {
    std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
    vector((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *)
           &__range4);
    __end0 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::begin((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                      *)local_50);
    map_a_ds_ref = (pair<const_unsigned_int,_int>)
                   std::
                   map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   ::end((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                          *)local_50);
    while (bVar2 = std::operator!=(&__end0,(_Self *)&map_a_ds_ref), bVar2) {
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator*(&__end0);
      local_a8 = *ppVar6;
      std::pair<unsigned_int,_int>::pair<int_&,_true>
                ((pair<unsigned_int,_int> *)&charac,&local_a8.first,&local_a8.second);
      std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
      push_back((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                 *)&__range4,(value_type *)&charac);
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator++(&__end0);
    }
    a_ds_rit.current._M_current._4_4_ = Field_Zp::characteristic(&this->coeff_field_);
    std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
    rbegin((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *)
           (local_d0 + 8));
    while( true ) {
      std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
      rend((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *)
           local_d0);
      bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>_>
                               *)(local_d0 + 8),
                              (reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>_>
                               *)local_d0);
      iVar4 = a_ds_rit.current._M_current._4_4_;
      bVar2 = false;
      if (bVar3) {
        EVar5 = Field_Zp::multiplicative_identity(&this->coeff_field_,0);
        bVar2 = iVar4 != EVar5;
      }
      iVar4 = a_ds_rit.current._M_current._4_4_;
      if (!bVar2) break;
      ppVar7 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>_>
                             *)(local_d0 + 8));
      local_d8 = Field_Zp::inverse(&this->coeff_field_,ppVar7->second,
                                   a_ds_rit.current._M_current._4_4_);
      std::tie<int,int>((int *)local_e8,&prod);
      std::tuple<int&,int&>::operator=(local_e8,&local_d8);
      AVar1 = prod;
      EVar5 = Field_Zp::additive_identity(&this->coeff_field_);
      if (AVar1 != EVar5) {
        boost::container::
        vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
        ::vec_iterator(&local_f0,sigma);
        ppVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>_>
                               *)(local_d0 + 8));
        destroy_cocycle(this,&local_f0,(A_ds_type *)&__range4,ppVar7->first,prod,local_b8);
        a_ds_rit.current._M_current._4_4_ = a_ds_rit.current._M_current._4_4_ / local_b8;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>_>
                    *)(local_d0 + 8));
    }
    EVar5 = Field_Zp::multiplicative_identity(&this->coeff_field_,0);
    if ((iVar4 != EVar5) &&
       (map_a_ds._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < this->dim_max_)) {
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
      ::vec_iterator(&local_f8,sigma);
      EVar5 = Field_Zp::multiplicative_identity
                        (&this->coeff_field_,a_ds_rit.current._M_current._4_4_);
      create_cocycle(this,&local_f8,EVar5,a_ds_rit.current._M_current._4_4_);
    }
    std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
    ~vector((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *)
            &__range4);
  }
  std::
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~map((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          *)local_50);
  return;
}

Assistant:

void update_cohomology_groups(Simplex_handle sigma, int dim_sigma) {
// Compute the annotation of the boundary of sigma:
    std::map<Simplex_key, Arith_element> map_a_ds;
    annotation_of_the_boundary(map_a_ds, sigma, dim_sigma);
// Update the cohomology groups:
    if (map_a_ds.empty()) {  // sigma is a creator in all fields represented in coeff_field_
      if (dim_sigma < dim_max_) {
        create_cocycle(sigma, coeff_field_.multiplicative_identity(),
                       coeff_field_.characteristic());
      }
    } else {        // sigma is a destructor in at least a field in coeff_field_
      // Convert map_a_ds to a vector
      A_ds_type a_ds;  // admits reverse iterators
      for (auto map_a_ds_ref : map_a_ds) {
        a_ds.push_back(
            std::pair<Simplex_key, Arith_element>(map_a_ds_ref.first,
                                                  map_a_ds_ref.second));
      }

      Arith_element inv_x, charac;
      Arith_element prod = coeff_field_.characteristic();  // Product of characteristic of the fields
      for (auto a_ds_rit = a_ds.rbegin();
          (a_ds_rit != a_ds.rend())
              && (prod != coeff_field_.multiplicative_identity()); ++a_ds_rit) {
        std::tie(inv_x, charac) = coeff_field_.inverse(a_ds_rit->second, prod);

        if (inv_x != coeff_field_.additive_identity()) {
          destroy_cocycle(sigma, a_ds, a_ds_rit->first, inv_x, charac);
          prod /= charac;
        }
      }
      if (prod != coeff_field_.multiplicative_identity()
          && dim_sigma < dim_max_) {
        create_cocycle(sigma, coeff_field_.multiplicative_identity(prod), prod);
      }
    }
  }